

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLs_AccessLMem(void *cvode_mem,char *fname,CVodeMem *cv_mem,CVLsMem *cvls_mem)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    line = 0x7d6;
  }
  else {
    *cv_mem = (CVodeMem)cvode_mem;
    if (*(CVLsMem *)((long)cvode_mem + 0x7e0) != (CVLsMem)0x0) {
      *cvls_mem = *(CVLsMem *)((long)cvode_mem + 0x7e0);
      return 0;
    }
    msgfmt = "Linear solver memory is NULL.";
    error_code = -2;
    line = 0x7dd;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,fname,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int cvLs_AccessLMem(void* cvode_mem, const char* fname, CVodeMem* cv_mem,
                    CVLsMem* cvls_mem)
{
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, fname, __FILE__,
                   MSG_LS_CVMEM_NULL);
    return (CVLS_MEM_NULL);
  }
  *cv_mem = (CVodeMem)cvode_mem;
  if ((*cv_mem)->cv_lmem == NULL)
  {
    cvProcessError(*cv_mem, CVLS_LMEM_NULL, __LINE__, fname, __FILE__,
                   MSG_LS_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  *cvls_mem = (CVLsMem)(*cv_mem)->cv_lmem;
  return (CVLS_SUCCESS);
}